

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

char * Wlc_PrsFindRange(char *pStr,int *End,int *Beg)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  *Beg = 0;
  *End = 0;
  do {
    pcVar7 = pStr;
    pStr = pcVar7 + 1;
  } while (*pcVar7 == ' ');
  pcVar6 = pcVar7 + 1;
  if (*pcVar7 != '[') {
    return pcVar7;
  }
  do {
    pcVar7 = pcVar6;
    pcVar6 = pcVar7 + 1;
  } while (*pcVar7 == ' ');
  if ((byte)(*pcVar7 - 0x3aU) < 0xf6) {
    return (char *)0x0;
  }
  iVar4 = atoi(pcVar7);
  *Beg = iVar4;
  *End = iVar4;
  cVar3 = *pcVar7;
  if (cVar3 != '\0') {
    bVar1 = true;
    cVar5 = cVar3;
    do {
      if ((bool)(bVar1 & cVar5 == ':')) {
        if (cVar3 == '\0') goto LAB_0030008a;
        bVar1 = true;
        goto LAB_0030005c;
      }
      bVar8 = cVar5 != '\\';
      bVar2 = cVar5 == ' ';
      if (!bVar8) {
        bVar2 = bVar8;
      }
      if (bVar1) {
        bVar2 = bVar8;
      }
      bVar1 = bVar2;
      cVar5 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar5 != '\0');
    if (cVar3 != '\0') {
      bVar1 = true;
      do {
        if ((bool)(bVar1 & cVar3 == ']')) goto LAB_003000e2;
        bVar8 = cVar3 != '\\';
        bVar2 = cVar3 == ' ';
        if (!bVar8) {
          bVar2 = bVar8;
        }
        if (bVar1) {
          bVar2 = bVar8;
        }
        bVar1 = bVar2;
        cVar3 = pcVar7[1];
        pcVar7 = pcVar7 + 1;
      } while (cVar3 != '\0');
    }
  }
LAB_003000df:
  pcVar7 = (char *)0x0;
LAB_003000e2:
  if ((pcVar7 != (char *)0x0) && (*Beg <= *End)) {
    return pcVar7 + 1;
  }
  return (char *)0x0;
  while( true ) {
    bVar8 = cVar3 != '\\';
    bVar2 = cVar3 == ' ';
    if (!bVar8) {
      bVar2 = bVar8;
    }
    if (bVar1) {
      bVar2 = bVar8;
    }
    bVar1 = bVar2;
    cVar3 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
    if (cVar3 == '\0') break;
LAB_0030005c:
    if ((bool)(bVar1 & cVar3 == ':')) goto LAB_0030008d;
  }
LAB_0030008a:
  pcVar7 = (char *)0x0;
LAB_0030008d:
  do {
    pcVar6 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while (*pcVar6 == ' ');
  if ((byte)(*pcVar6 - 0x3aU) < 0xf6) {
    return (char *)0x0;
  }
  iVar4 = atoi(pcVar7);
  *Beg = iVar4;
  cVar3 = *pcVar7;
  if (cVar3 != '\0') {
    bVar1 = true;
    do {
      if ((bool)(bVar1 & cVar3 == ']')) goto LAB_003000e2;
      bVar8 = cVar3 != '\\';
      bVar2 = cVar3 == ' ';
      if (!bVar8) {
        bVar2 = bVar8;
      }
      if (bVar1) {
        bVar2 = bVar8;
      }
      bVar1 = bVar2;
      cVar3 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while (cVar3 != '\0');
  }
  goto LAB_003000df;
}

Assistant:

static inline char * Wlc_PrsFindRange( char * pStr, int * End, int * Beg )
{
    *End = *Beg = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '[' )
        return pStr;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( !Wlc_PrsIsDigit(pStr) )
        return NULL;
    *End = *Beg = atoi( pStr );
    if ( Wlc_PrsFindSymbol( pStr, ':' ) == NULL )
    {
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    else
    {
        pStr = Wlc_PrsFindSymbol( pStr, ':' );
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( !Wlc_PrsIsDigit(pStr) )
            return NULL;
        *Beg = atoi( pStr );
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    if ( *End < *Beg )
        return NULL;
    assert( *End >= *Beg );
    return pStr + 1;
}